

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O0

bool anon_unknown.dwarf_71625::findPoint<double>
               (vector<int,_std::allocator<int>_> *data,vector<int,_std::allocator<int>_> *second,
               vector<double,_std::allocator<double>_> *edge,uint32_t leftSideOffset,
               uint32_t rightSideOffset,int minimumContrast,bool checkContrast,
               uint32_t leftSideContrastCheck,uint32_t rightSideContrastCheck,uint32_t position,
               uint32_t size)

{
  double dVar1;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __first_00;
  reference piVar2;
  const_reference pvVar3;
  vector<int,_std::allocator<int>_> *in_RSI;
  int in_R9D;
  float fVar4;
  float fVar5;
  vector<double,_std::allocator<double>_> *this;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_ZMM0 [64];
  byte in_stack_00000008;
  uint in_stack_00000010;
  int in_stack_00000018;
  uint in_stack_00000020;
  uint in_stack_00000028;
  double sumWhite;
  double sumBlack;
  uint32_t whiteContrastEnd;
  uint32_t blackContrastStart;
  uint32_t whiteContrastStart;
  uint32_t blackContrastEnd;
  int minIntensity;
  int maxIntensity;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffeb8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffec0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffffec8
  ;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  value_type vVar9;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  int local_6c;
  int *local_68;
  int *local_60;
  int *local_58;
  int *local_50;
  int *local_48;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  int local_34;
  byte local_2d;
  int local_2c;
  vector<int,_std::allocator<int>_> *local_18;
  bool local_1;
  
  auVar8 = in_ZMM0._0_16_;
  local_2d = in_stack_00000008 & 1;
  local_2c = in_R9D;
  local_18 = in_RSI;
  local_50 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              (in_stack_fffffffffffffeb8._M_current);
  local_48 = (int *)__gnu_cxx::
                    __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0._M_current);
  local_68 = (int *)std::vector<int,_std::allocator<int>_>::begin
                              (in_stack_fffffffffffffeb8._M_current);
  local_60 = (int *)__gnu_cxx::
                    __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0._M_current);
  local_58 = (int *)__gnu_cxx::
                    __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0._M_current);
  __first._M_current._4_4_ = in_stack_fffffffffffffedc;
  __first._M_current._0_4_ = in_stack_fffffffffffffed8;
  local_40 = std::
             max_element<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                       (__first,in_stack_fffffffffffffed0);
  piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
           operator*(&local_40);
  local_34 = *piVar2;
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb8._M_current);
  __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
            (in_stack_fffffffffffffec8,(difference_type)in_stack_fffffffffffffec0._M_current);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb8._M_current);
  __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
            (in_stack_fffffffffffffec8,(difference_type)in_stack_fffffffffffffec0._M_current);
  __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
            (in_stack_fffffffffffffec8,(difference_type)in_stack_fffffffffffffec0._M_current);
  __first_00._M_current._4_4_ = in_stack_fffffffffffffedc;
  __first_00._M_current._0_4_ = in_stack_fffffffffffffed8;
  local_78 = std::
             min_element<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                       (__first_00,in_stack_fffffffffffffed0);
  piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
           operator*(&local_78);
  local_6c = *piVar2;
  if (local_34 - local_6c < local_2c) {
    local_1 = false;
  }
  else {
    if ((((local_2d & 1) != 0) && (in_stack_00000010 <= in_stack_00000020)) &&
       (in_stack_00000018 + in_stack_00000020 < in_stack_00000028)) {
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb8._M_current);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                (in_stack_fffffffffffffec8,(difference_type)in_stack_fffffffffffffec0._M_current);
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb8._M_current);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                (in_stack_fffffffffffffec8,(difference_type)in_stack_fffffffffffffec0._M_current);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                (in_stack_fffffffffffffec8,(difference_type)in_stack_fffffffffffffec0._M_current);
      fVar4 = std::
              accumulate<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,float>
                        (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,0.0);
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb8._M_current);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                (in_stack_fffffffffffffec8,(difference_type)in_stack_fffffffffffffec0._M_current);
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb8._M_current);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                (in_stack_fffffffffffffec8,(difference_type)in_stack_fffffffffffffec0._M_current);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                (in_stack_fffffffffffffec8,(difference_type)in_stack_fffffffffffffec0._M_current);
      fVar5 = std::
              accumulate<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,float>
                        (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,0.0);
      auVar6._0_8_ = (double)fVar5;
      auVar6._8_8_ = extraout_XMM0_Qb;
      auVar8 = vcvtusi2sd_avx512f(auVar6,in_stack_00000010 + 1);
      auVar7._0_8_ = (double)fVar4 / auVar8._0_8_;
      auVar7._8_8_ = 0;
      auVar8 = vcvtusi2sd_avx512f(auVar7,in_stack_00000018);
      dVar1 = auVar6._0_8_ / auVar8._0_8_ - auVar7._0_8_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar1;
      if ((double)local_2c <= dVar1) {
        local_2d = 0;
      }
    }
    if ((local_2d & 1) == 0) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(ulong)in_stack_00000020)
      ;
      vVar9 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         (local_18,(ulong)(in_stack_00000020 + 1));
      if (vVar9 == *pvVar3) {
        vcvtusi2ss_avx512f(auVar8,in_stack_00000020);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffec0._M_current,
                   (value_type_conflict4 *)in_stack_fffffffffffffeb8._M_current);
      }
      else {
        vcvtusi2sd_avx512f(auVar8,in_stack_00000020);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           (local_18,(ulong)in_stack_00000020);
        this = (vector<double,_std::allocator<double>_> *)(double)*pvVar3;
        std::vector<int,_std::allocator<int>_>::operator[](local_18,(ulong)in_stack_00000020);
        std::vector<int,_std::allocator<int>_>::operator[](local_18,(ulong)(in_stack_00000020 + 1));
        std::vector<double,_std::allocator<double>_>::push_back
                  (this,(value_type_conflict4 *)in_stack_fffffffffffffeb8._M_current);
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool findPoint( const std::vector< int > & data, const std::vector< int > & second, std::vector< _Type > & edge,
                    uint32_t leftSideOffset, uint32_t rightSideOffset, int minimumContrast, bool checkContrast,
                    uint32_t leftSideContrastCheck, uint32_t rightSideContrastCheck, uint32_t position, uint32_t size )
    {
        const int maxIntensity = *(std::max_element( data.begin() + leftSideOffset, data.begin() + rightSideOffset + 1 ));
        const int minIntensity = *(std::min_element( data.begin() + leftSideOffset, data.begin() + rightSideOffset + 1 ));

        if ( maxIntensity - minIntensity < minimumContrast )
            return false;

        if ( checkContrast && leftSideContrastCheck <= position && (rightSideContrastCheck + position) < size ) {
            const uint32_t blackContrastEnd   = position;
            const uint32_t whiteContrastStart = position + 1;

            const uint32_t blackContrastStart = position - leftSideContrastCheck;
            const uint32_t whiteContrastEnd   = position + rightSideContrastCheck;

            _Type sumBlack = std::accumulate( data.begin() + blackContrastStart, data.begin() + blackContrastEnd + 1, 0.0f );
            _Type sumWhite = std::accumulate( data.begin() + whiteContrastStart, data.begin() + whiteContrastEnd + 1, 0.0f );

            sumBlack /= (blackContrastEnd - blackContrastStart + 1);
            sumWhite /= (whiteContrastEnd - whiteContrastStart + 1);

            if ( sumWhite - sumBlack >= minimumContrast )
                checkContrast = false;
        }

        if ( !checkContrast ) {
            if ( second[position] != second[position + 1] )
                edge.push_back( position + static_cast<_Type>(second[position]) / (second[position] - second[position + 1u]) );
            else
                edge.push_back( position + 0.5f );
            return true;
        }

        return false;
    }